

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

_Bool container_equals(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2)

{
  undefined1 uVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,type1);
  if (uVar2 == 4) {
    uVar2 = (uint)*(byte *)((long)c1 + 8);
  }
  if (type2 == '\x04') {
    type2 = *(byte *)((long)c2 + 8);
    c2 = *c2;
  }
  uVar1 = (*(code *)(&DAT_00120034 +
                    *(int *)(&DAT_00120034 + (ulong)(((uint)type2 + (uVar2 & 0xff) * 4) - 5) * 4)))
                    (c1,&DAT_00120034,c2,
                     &DAT_00120034 +
                     *(int *)(&DAT_00120034 + (ulong)(((uint)type2 + (uVar2 & 0xff) * 4) - 5) * 4));
  return (_Bool)uVar1;
}

Assistant:

static inline bool container_equals(const container_t *c1, uint8_t type1,
                                    const container_t *c2, uint8_t type2) {
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET, BITSET):
            return bitset_container_equals(const_CAST_bitset(c1),
                                           const_CAST_bitset(c2));

        case CONTAINER_PAIR(BITSET, RUN):
            return run_container_equals_bitset(const_CAST_run(c2),
                                               const_CAST_bitset(c1));

        case CONTAINER_PAIR(RUN, BITSET):
            return run_container_equals_bitset(const_CAST_run(c1),
                                               const_CAST_bitset(c2));

        case CONTAINER_PAIR(BITSET, ARRAY):
            // java would always return false?
            return array_container_equal_bitset(const_CAST_array(c2),
                                                const_CAST_bitset(c1));

        case CONTAINER_PAIR(ARRAY, BITSET):
            // java would always return false?
            return array_container_equal_bitset(const_CAST_array(c1),
                                                const_CAST_bitset(c2));

        case CONTAINER_PAIR(ARRAY, RUN):
            return run_container_equals_array(const_CAST_run(c2),
                                              const_CAST_array(c1));

        case CONTAINER_PAIR(RUN, ARRAY):
            return run_container_equals_array(const_CAST_run(c1),
                                              const_CAST_array(c2));

        case CONTAINER_PAIR(ARRAY, ARRAY):
            return array_container_equals(const_CAST_array(c1),
                                          const_CAST_array(c2));

        case CONTAINER_PAIR(RUN, RUN):
            return run_container_equals(const_CAST_run(c1), const_CAST_run(c2));

        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}